

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_port.h
# Opt level: O2

void __thiscall
sc_core::sc_port<sc_core::sc_signal_in_if<bool>,_1,_(sc_core::sc_port_policy)0>::sc_port
          (sc_port<sc_core::sc_signal_in_if<bool>,_1,_(sc_core::sc_port_policy)0> *this,char *name_,
          sc_signal_in_if<bool> *interface_)

{
  socklen_t __len;
  sockaddr *__addr;
  
  __len = 0;
  sc_port_b<sc_core::sc_signal_in_if<bool>_>::sc_port_b
            (&this->super_sc_port_b<sc_core::sc_signal_in_if<bool>_>,name_,1,SC_ONE_OR_MORE_BOUND);
  (this->super_sc_port_b<sc_core::sc_signal_in_if<bool>_>).super_sc_port_base.super_sc_object.
  _vptr_sc_object = (_func_int **)&PTR_print_00261830;
  sc_warn_port_constructor();
  sc_port_b<sc_core::sc_signal_in_if<bool>_>::bind
            (&this->super_sc_port_b<sc_core::sc_signal_in_if<bool>_>,(int)interface_,__addr,__len);
  return;
}

Assistant:

sc_port( const char* name_, IF& interface_ )
	: base_type( name_, N, P )
	{ sc_warn_port_constructor(); base_type::bind( interface_ ); }